

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O2

void duckdb::TemplatedFillLoop<signed_char>
               (Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  data_ptr_t pdVar1;
  data_t *pdVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t i_2;
  idx_t row_idx;
  ulong row_idx_00;
  idx_t i;
  idx_t iVar6;
  bool valid;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_78;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (vector->vector_type == CONSTANT_VECTOR) {
    pdVar2 = vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
        uVar4 = uVar5;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)sel->sel_vector[uVar5];
        }
        pdVar1[uVar4] = *pdVar2;
      }
    }
    else {
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        row_idx = iVar6;
        if (sel->sel_vector != (sel_t *)0x0) {
          row_idx = (idx_t)sel->sel_vector[iVar6];
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(ulong)count,&local_78);
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = uVar5;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_78.sel)->sel_vector[uVar5];
      }
      row_idx_00 = uVar5;
      if (sel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (ulong)sel->sel_vector[uVar5];
      }
      pdVar1[row_idx_00] = local_78.data[uVar4];
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        valid = true;
      }
      else {
        valid = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0;
      }
      TemplatedValidityMask<unsigned_long>::Set
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx_00,valid);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}